

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void onClose(Ptr *ss)

{
  _Impl *this;
  uint uVar1;
  pointer p_Var2;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  Ptr local_58;
  _Impl *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  allocator_type local_21 [8];
  __allocator_type __a2;
  
  uVar1 = (*(((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Task)._vptr_Task[4])();
  p_Var2 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(local_21,1);
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e4e8;
  local_78._8_8_ = 0;
  this = &p_Var2->_M_impl;
  local_78._M_unused._0_8_ = (undefined8)(ulong)uVar1;
  local_60 = std::
             _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:152:25)_()>_>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:152:25)_()>_>
             ::_M_manager;
  local_38._M_alloc = local_21;
  local_38._M_ptr = p_Var2;
  hwnet::ClosureTask::ClosureTask((ClosureTask *)this,(Callback *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  local_38._M_ptr = (pointer)0x0;
  local_48 = this;
  _Stack_40._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<hwnet::ClosureTask,_std::allocator<hwnet::ClosureTask>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  std::__shared_ptr<hwnet::ClosureTask,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<hwnet::ClosureTask,hwnet::ClosureTask>
            ((__shared_ptr<hwnet::ClosureTask,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (ClosureTask *)this);
  local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48;
  local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_40._M_pi;
  local_48 = (_Impl *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hwnet::ThreadPool::TaskQueue::PostTask(&mainThread.queue_,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  puts("onClose");
  return;
}

Assistant:

void onClose(const TCPSocket::Ptr &ss) {
	auto fd = ss->Fd();
	mainThread.PostClosure([fd](){
		for(size_t i = 0 ; i < clients.size(); i++) {
			if(clients[i]->Fd() == fd) {
				clientcount--;
				swap(clients[i],clients[clients.size()-1]);
				clients.pop_back();
				if(clientcount == 0){
					poller_.Stop();
				}
			}
		}		
	});  
	printf("onClose\n");
}